

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_tests.cpp
# Opt level: O2

void __thiscall logging_tests::LogSetup::LogSetup(LogSetup *this)

{
  TestOpts opts;
  Logger *pLVar1;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff48;
  __buckets_ptr in_stack_ffffffffffffff50;
  pointer in_stack_ffffffffffffff58;
  __node_base in_stack_ffffffffffffff60;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_78;
  undefined4 local_60;
  undefined1 local_5c;
  path local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60 = 0x1010101;
  local_5c = 0;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffff50;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffff48;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffff58;
  opts._24_8_ = in_stack_ffffffffffffff60._M_nxt;
  BasicTestingSetup::BasicTestingSetup(&this->super_BasicTestingSetup,MAIN,opts);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_78);
  pLVar1 = LogInstance();
  std::filesystem::__cxx11::path::path
            (&(this->prev_log_path).super_path,&(pLVar1->m_file_path).super_path);
  ArgsManager::GetDataDirBase((path *)&local_58,&(this->super_BasicTestingSetup).m_args);
  fs::path::operator/=((path *)&local_58,"tmp_debug.log");
  std::filesystem::__cxx11::path::path(&(this->tmp_log_path).super_path,&local_58);
  std::filesystem::__cxx11::path::~path(&local_58);
  pLVar1 = LogInstance();
  this->prev_reopen_file = (bool)((pLVar1->m_reopen_file)._M_base._M_i & 1);
  pLVar1 = LogInstance();
  this->prev_print_to_file = pLVar1->m_print_to_file;
  pLVar1 = LogInstance();
  this->prev_log_timestamps = pLVar1->m_log_timestamps;
  pLVar1 = LogInstance();
  this->prev_log_threadnames = pLVar1->m_log_threadnames;
  pLVar1 = LogInstance();
  this->prev_log_sourcelocations = pLVar1->m_log_sourcelocations;
  pLVar1 = LogInstance();
  BCLog::Logger::CategoryLevels(&this->prev_category_levels,pLVar1);
  pLVar1 = LogInstance();
  this->prev_log_level = (pLVar1->m_log_level)._M_i;
  pLVar1 = LogInstance();
  std::filesystem::__cxx11::path::operator=
            (&(pLVar1->m_file_path).super_path,(path *)&this->tmp_log_path);
  pLVar1 = LogInstance();
  LOCK();
  (pLVar1->m_reopen_file)._M_base._M_i = true;
  UNLOCK();
  pLVar1 = LogInstance();
  pLVar1->m_print_to_file = true;
  pLVar1 = LogInstance();
  pLVar1->m_log_timestamps = false;
  pLVar1 = LogInstance();
  pLVar1->m_log_threadnames = false;
  pLVar1 = LogInstance();
  pLVar1->m_log_sourcelocations = false;
  pLVar1 = LogInstance();
  LOCK();
  (pLVar1->m_log_level)._M_i = Debug;
  UNLOCK();
  pLVar1 = LogInstance();
  BCLog::Logger::SetCategoryLogLevel
            (pLVar1,(unordered_map<BCLog::LogFlags,_BCLog::Level,_std::hash<BCLog::LogFlags>,_std::equal_to<BCLog::LogFlags>,_std::allocator<std::pair<const_BCLog::LogFlags,_BCLog::Level>_>_>
                     *)&stack0xffffffffffffff50);
  std::
  _Hashtable<BCLog::LogFlags,_std::pair<const_BCLog::LogFlags,_BCLog::Level>,_std::allocator<std::pair<const_BCLog::LogFlags,_BCLog::Level>_>,_std::__detail::_Select1st,_std::equal_to<BCLog::LogFlags>,_std::hash<BCLog::LogFlags>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<BCLog::LogFlags,_std::pair<const_BCLog::LogFlags,_BCLog::Level>,_std::allocator<std::pair<const_BCLog::LogFlags,_BCLog::Level>_>,_std::__detail::_Select1st,_std::equal_to<BCLog::LogFlags>,_std::hash<BCLog::LogFlags>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&stack0xffffffffffffff50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

LogSetup() : prev_log_path{LogInstance().m_file_path},
                 tmp_log_path{m_args.GetDataDirBase() / "tmp_debug.log"},
                 prev_reopen_file{LogInstance().m_reopen_file},
                 prev_print_to_file{LogInstance().m_print_to_file},
                 prev_log_timestamps{LogInstance().m_log_timestamps},
                 prev_log_threadnames{LogInstance().m_log_threadnames},
                 prev_log_sourcelocations{LogInstance().m_log_sourcelocations},
                 prev_category_levels{LogInstance().CategoryLevels()},
                 prev_log_level{LogInstance().LogLevel()}
    {
        LogInstance().m_file_path = tmp_log_path;
        LogInstance().m_reopen_file = true;
        LogInstance().m_print_to_file = true;
        LogInstance().m_log_timestamps = false;
        LogInstance().m_log_threadnames = false;

        // Prevent tests from failing when the line number of the logs changes.
        LogInstance().m_log_sourcelocations = false;

        LogInstance().SetLogLevel(BCLog::Level::Debug);
        LogInstance().SetCategoryLogLevel({});
    }